

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O0

bool __thiscall
duckdb::BitpackingState<duckdb::hugeint_t,_duckdb::hugeint_t>::Update<duckdb::EmptyBitpackingWriter>
          (BitpackingState<duckdb::hugeint_t,_duckdb::hugeint_t> *this,hugeint_t value,bool is_valid
          )

{
  hugeint_t b;
  hugeint_t a;
  hugeint_t a_00;
  byte bVar1;
  byte bVar2;
  byte in_CL;
  int64_t *piVar3;
  int64_t in_RDX;
  int64_t in_RSI;
  long in_RDI;
  hugeint_t hVar4;
  bool success;
  BitpackingState<duckdb::hugeint_t,_duckdb::hugeint_t> *in_stack_00000050;
  undefined7 in_stack_ffffffffffffff60;
  byte bVar5;
  undefined6 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  int64_t in_stack_ffffffffffffff78;
  uint64_t local_68;
  int64_t local_60;
  BitpackingState<duckdb::hugeint_t,_duckdb::hugeint_t> *local_38;
  bool local_1;
  
  bVar1 = in_CL & 1;
  *(byte *)(in_RDI + 0x10018 + *(long *)(in_RDI + 0x10818)) = bVar1;
  bVar2 = 0;
  if ((*(byte *)(in_RDI + 0x108a0) & 1) != 0) {
    bVar2 = bVar1;
  }
  *(byte *)(in_RDI + 0x108a0) = bVar2;
  bVar5 = 0;
  if ((*(byte *)(in_RDI + 0x108a1) & 1) != 0) {
    bVar5 = bVar1 ^ 0xff;
  }
  *(byte *)(in_RDI + 0x108a1) = bVar5 & 1;
  if (bVar1 != 0) {
    piVar3 = (int64_t *)(*(long *)(in_RDI + 0x8010) + *(long *)(in_RDI + 0x10818) * 0x10);
    *piVar3 = in_RSI;
    piVar3[1] = in_RDX;
    a.lower._6_1_ = bVar2;
    a.lower._0_6_ = in_stack_ffffffffffffff70;
    a.lower._7_1_ = in_stack_ffffffffffffff77;
    a.upper = in_stack_ffffffffffffff78;
    hVar4.lower._7_1_ = bVar5;
    hVar4.lower._0_7_ = in_stack_ffffffffffffff60;
    hVar4.upper = in_RDI;
    hVar4 = MinValue<duckdb::hugeint_t>(a,hVar4);
    local_38 = (BitpackingState<duckdb::hugeint_t,_duckdb::hugeint_t> *)hVar4.lower;
    *(BitpackingState<duckdb::hugeint_t,_duckdb::hugeint_t> **)(in_RDI + 0x10830) = local_38;
    local_38 = (BitpackingState<duckdb::hugeint_t,_duckdb::hugeint_t> *)hVar4.upper;
    *(BitpackingState<duckdb::hugeint_t,_duckdb::hugeint_t> **)(in_RDI + 0x10838) = local_38;
    a_00.lower._6_1_ = bVar2;
    a_00.lower._0_6_ = in_stack_ffffffffffffff70;
    a_00.lower._7_1_ = in_stack_ffffffffffffff77;
    a_00.upper = in_RSI;
    b.lower._7_1_ = bVar5;
    b.lower._0_7_ = in_stack_ffffffffffffff60;
    b.upper = in_RDI;
    hVar4 = MaxValue<duckdb::hugeint_t>(a_00,b);
    local_68 = hVar4.lower;
    *(uint64_t *)(in_RDI + 0x10840) = local_68;
    local_60 = hVar4.upper;
    *(int64_t *)(in_RDI + 0x10848) = local_60;
  }
  *(long *)(in_RDI + 0x10818) = *(long *)(in_RDI + 0x10818) + 1;
  if (*(long *)(in_RDI + 0x10818) == 0x800) {
    bVar2 = Flush<duckdb::EmptyBitpackingWriter>(in_stack_00000050);
    Reset(local_38);
    local_1 = (bool)(bVar2 & 1);
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool Update(T value, bool is_valid) {
		compression_buffer_validity[compression_buffer_idx] = is_valid;
		all_valid = all_valid && is_valid;
		all_invalid = all_invalid && !is_valid;

		if (is_valid) {
			compression_buffer[compression_buffer_idx] = value;
			minimum = MinValue<T>(minimum, value);
			maximum = MaxValue<T>(maximum, value);
		}

		compression_buffer_idx++;

		if (compression_buffer_idx == BITPACKING_METADATA_GROUP_SIZE) {
			bool success = Flush<OP>();
			Reset();
			return success;
		}
		return true;
	}